

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

bool __thiscall helics::InputInfo::updateTimeUpTo(InputInfo *this,Time newTime)

{
  pointer pvVar1;
  dataRecord *pdVar2;
  dataRecord *update;
  bool bVar3;
  const_iterator __last;
  bool bVar4;
  int index;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *data_queue;
  pointer this_00;
  
  this_00 = (this->data_queues).
            super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->data_queues).
           super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  index = 0;
  do {
    if (this_00 == pvVar1) {
      return bVar4;
    }
    __last._M_current =
         (this_00->
         super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (this_00->
             super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((__last._M_current != pdVar2) &&
       (((__last._M_current)->time).internalTimeCode < newTime.internalTimeCode)) {
      do {
        update = __last._M_current;
        __last._M_current = update + 1;
        if (__last._M_current == pdVar2) break;
      } while (((__last._M_current)->time).internalTimeCode < newTime.internalTimeCode);
      bVar3 = updateData(this,update,index);
      std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
      erase(this_00,(this_00->
                    super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                    )._M_impl.super__Vector_impl_data._M_start,__last);
      bVar4 = (bool)(bVar4 | bVar3);
    }
    index = index + 1;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

bool InputInfo::updateTimeUpTo(Time newTime)
{
    int index{0};
    bool updated{false};
    for (auto& data_queue : data_queues) {
        auto currentValue = data_queue.begin();

        auto it_final = data_queue.end();
        if (currentValue == it_final) {
            ++index;
            continue;
        }
        if (currentValue->time >= newTime) {
            ++index;
            continue;
        }
        auto last = currentValue;
        ++currentValue;
        while ((currentValue != it_final) && (currentValue->time < newTime)) {
            last = currentValue;
            ++currentValue;
        }

        auto res = updateData(std::move(*last), index);
        data_queue.erase(data_queue.begin(), currentValue);
        ++index;
        if (res) {
            updated = true;
        }
    }
    return updated;
}